

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b-plus-tree.cpp
# Opt level: O0

int __thiscall BPTree::display(BPTree *this,Node *cursor,int nodecount,bool first)

{
  int iVar1;
  ostream *poVar2;
  int local_3c;
  int local_38;
  int i_2;
  int i_1;
  int thisnode;
  int j;
  int i;
  bool first_local;
  int nodecount_local;
  Node *cursor_local;
  BPTree *this_local;
  
  if (first) {
    for (thisnode = 0; thisnode < cursor->size + 1; thisnode = thisnode + 1) {
      if (thisnode != cursor->size) {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,cursor->key[thisnode].key_value);
        std::operator<<(poVar2,"\n");
      }
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
      std::operator<<(poVar2,"\n");
      for (i_1 = 0; i_1 < cursor->ptr[thisnode]->size; i_1 = i_1 + 1) {
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,cursor->ptr[thisnode]->key[i_1].key_value);
        std::operator<<(poVar2," ");
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
    this_local._4_4_ = 0;
  }
  else if ((cursor->IS_LEAF & 1U) == 0) {
    i = nodecount;
    for (local_38 = 0; local_38 < cursor->size + 1; local_38 = local_38 + 1) {
      iVar1 = display(this,cursor->ptr[local_38],0,false);
      i = i + iVar1;
    }
    this_local._4_4_ = i + 1;
  }
  else if ((cursor->IS_LEAF & 1U) == 1) {
    for (local_3c = 0; local_3c < cursor->size; local_3c = local_3c + 1) {
      poVar2 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,cursor->key[local_3c].key_value);
      std::operator<<(poVar2," ");
    }
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int display(Node* cursor, int nodecount, bool first) {
        if (first == true) {
            for (int i = 0;i<cursor->size+1 ; i++){
                if (i!=cursor->size) {
                    cout << 0 << " " << cursor->key[i].key_value << "\n";
                }
                cout << 1 << "\n";
                //cout << cursor->ptr[i]->size << " Size \n";
                for (int j = 0; j<cursor->ptr[i]->size; j++){
                    cout << cursor->ptr[i]->key[j].key_value << " ";
                }
                cout << "\n";
            }
            return 0;
        }
        else {
        int thisnode;
        if (cursor->IS_LEAF == false) {
            for (int i = 0; i < cursor->size + 1; i++) {
                thisnode = display(cursor->ptr[i], 0, false);
                nodecount = nodecount + thisnode;
                //cout<<"\n"<<nodecount<<"\n";

                //read(curr->child_ptr[i]);

            }
            nodecount++;
            return nodecount;
        }
        if (cursor->IS_LEAF == true) {

            for (int i = 0; i < cursor->size; i++) {
                cout << cursor->key[i].key_value << " ";
            }
            return 1;
        }
        return 0;
    }
    }